

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void appendColsToLpVectors
               (HighsLp *lp,HighsInt num_new_col,vector<double,_std::allocator<double>_> *colCost,
               vector<double,_std::allocator<double>_> *colLower,
               vector<double,_std::allocator<double>_> *colUpper)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference this;
  reference pvVar7;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  int in_ESI;
  int *in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  byte bVar8;
  byte bVar9;
  HighsInt iCol;
  HighsInt new_col;
  bool have_names;
  bool have_integrality;
  HighsInt new_num_col;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  
  if (in_ESI != 0) {
    iVar2 = *in_RDI + in_ESI;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                       CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)
                                      )),
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                       CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)
                                      )),
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                       CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)
                                      )),
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    sVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                      ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x5e));
    bVar8 = sVar4 != 0;
    if ((bool)bVar8) {
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                 CONCAT44(iVar2,CONCAT13(bVar8,CONCAT12(in_stack_ffffffffffffffd2,
                                                        in_stack_ffffffffffffffd0))),
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x52));
    bVar9 = sVar4 != 0;
    if ((bool)bVar9) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(iVar2,CONCAT13(bVar8,CONCAT12(bVar9,in_stack_ffffffffffffffd0))),
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      iVar3 = *in_RDI + iVar2;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)iVar2);
      vVar1 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)iVar3);
      *pvVar6 = vVar1;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)iVar2);
      vVar1 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)iVar3);
      *pvVar6 = vVar1;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)iVar2);
      vVar1 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)iVar3);
      *pvVar6 = vVar1;
      if ((bVar9 & 1) != 0) {
        this = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x52),(long)iVar3);
        std::__cxx11::string::operator=((string *)this,"");
      }
      if ((bVar8 & 1) != 0) {
        pvVar7 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x5e),
                            (long)iVar3);
        *pvVar7 = kContinuous;
      }
    }
  }
  return;
}

Assistant:

void appendColsToLpVectors(HighsLp& lp, const HighsInt num_new_col,
                           const vector<double>& colCost,
                           const vector<double>& colLower,
                           const vector<double>& colUpper) {
  assert(num_new_col >= 0);
  if (num_new_col == 0) return;
  HighsInt new_num_col = lp.num_col_ + num_new_col;
  lp.col_cost_.resize(new_num_col);
  lp.col_lower_.resize(new_num_col);
  lp.col_upper_.resize(new_num_col);
  const bool have_integrality = (lp.integrality_.size() != 0);
  if (have_integrality) {
    assert(HighsInt(lp.integrality_.size()) == lp.num_col_);
    lp.integrality_.resize(new_num_col);
  }
  bool have_names = (lp.col_names_.size() != 0);
  if (have_names) lp.col_names_.resize(new_num_col);
  for (HighsInt new_col = 0; new_col < num_new_col; new_col++) {
    HighsInt iCol = lp.num_col_ + new_col;
    lp.col_cost_[iCol] = colCost[new_col];
    lp.col_lower_[iCol] = colLower[new_col];
    lp.col_upper_[iCol] = colUpper[new_col];
    // Cannot guarantee to create unique names, so name is blank
    if (have_names) lp.col_names_[iCol] = "";
    if (have_integrality) lp.integrality_[iCol] = HighsVarType::kContinuous;
  }
}